

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_representation_half.cpp
# Opt level: O0

void __thiscall MyTest_TestFormula_Test::~MyTest_TestFormula_Test(MyTest_TestFormula_Test *this)

{
  MyTest_TestFormula_Test *in_stack_00000010;
  
  ~MyTest_TestFormula_Test(in_stack_00000010);
  return;
}

Assistant:

TEST_P(MyTest, TestFormula)
{
    uint64_t const in_number = std::get<0>(GetParam());
    uint64_t const out_number = std::get<1>(GetParam());

    fp_t d = reinterpret_double_bits_as(in_number);
    fp_t expected = reinterpret_double_bits_as(out_number);

    // IEEE half.
    flexfloat<5, 10> fx = d;
    fp_t recoverd_fx = (fp_t)(fx);

     printf("number:     \t"); show(d);
     printf("recoverd_fx:\t"); show(recoverd_fx);
     printf("expected:   \t"); show(expected);

    // Enforces the same reprsentation for nan's.
    uint_t out = reinterpret_as_double_bits(recoverd_fx);

    #ifndef FLEXFLOAT_ON_SINGLE
    #ifdef FLEXFLOAT_ROUNDING
    ASSERT_EQ(out, out_number);
    #endif
    #endif
    // ASSERT_EQ(recoverd_fx, expected); // does not work for NAN's.
}